

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_reconstruct_tx
               (AV1_COMMON *cm,ThreadData *td,aom_reader *r,MB_MODE_INFO *mbmi,int plane,
               BLOCK_SIZE plane_bsize,int blk_row,int blk_col,int block,TX_SIZE tx_size,
               int *eob_total)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  aom_reader *in_RCX;
  ThreadData *in_RDX;
  AV1_COMMON *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  TX_SIZE TStack0000000000000018;
  byte in_stack_00000020;
  undefined7 in_stack_00000021;
  int *in_stack_00000028;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int col_end;
  int row_end;
  int sub_step;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  eob_info *eob_data;
  int max_blocks_wide;
  int max_blocks_high;
  TX_SIZE plane_tx_size;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  BLOCK_SIZE in_stack_ffffffffffffff37;
  int local_a8;
  int local_a4;
  int local_8c;
  int local_84;
  AV1_COMMON *pAVar4;
  undefined3 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  undefined4 uVar6;
  aom_reader *r_00;
  AV1_COMMON *pAVar7;
  
  uVar5 = CONCAT13(in_R9B,in_stack_ffffffffffffffc8);
  pAVar4 = in_RSI;
  pAVar7 = in_RSI;
  if (in_R8D == 0) {
    r_00 = in_RCX;
    iVar3 = av1_get_txb_size_index(in_R9B,in_stack_00000008,in_stack_00000010);
    bVar2 = *(byte *)((long)&in_RCX[2].ec.buf + (long)iVar3 + 2);
  }
  else {
    bVar2 = av1_get_max_uv_txsize
                      (in_stack_ffffffffffffff37,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c
                      );
    r_00 = in_RCX;
  }
  local_a4 = max_block_high((MACROBLOCKD *)in_RSI,(BLOCK_SIZE)((uint)uVar5 >> 0x18),in_R8D);
  local_a8 = max_block_wide((MACROBLOCKD *)in_RSI,(BLOCK_SIZE)((uint)uVar5 >> 0x18),in_R8D);
  if ((in_stack_00000008 < local_a4) && (in_stack_00000010 < local_a8)) {
    if ((in_stack_00000020 == bVar2) || (in_R8D != 0)) {
      (*(code *)pAVar7[10].quant_params.giqmatrix[2][1][0xc])
                (in_RDI,pAVar4,in_RDX,in_R8D,in_stack_00000008,in_stack_00000010,in_stack_00000020);
      (*(code *)pAVar7[10].quant_params.giqmatrix[2][1][0xd])
                (in_RDI,pAVar4,in_RDX,in_R8D,in_stack_00000008,in_stack_00000010,in_stack_00000020);
      *in_stack_00000028 =
           (uint)*(ushort *)
                  ((pAVar4->quant_params).gqmatrix[0xf][1][(long)in_R8D + 10] +
                  (long)(int)(uint)*(ushort *)
                                    ((long)(pAVar4->quant_params).gqmatrix[0xf][1] +
                                    (long)in_R8D * 2 + 0x68) * 4) + *in_stack_00000028;
      set_cb_buffer_offsets((DecoderCodingBlock *)pAVar4,in_stack_00000020,in_R8D);
    }
    else {
      iVar3 = tx_size_wide_unit[""[in_stack_00000020]];
      iVar1 = tx_size_high_unit[""[in_stack_00000020]];
      if (tx_size_high_unit[in_stack_00000020] < local_a4 - in_stack_00000008) {
        local_a4 = tx_size_high_unit[in_stack_00000020];
      }
      else {
        local_a4 = local_a4 - in_stack_00000008;
      }
      if (tx_size_wide_unit[in_stack_00000020] < local_a8 - in_stack_00000010) {
        local_a8 = tx_size_wide_unit[in_stack_00000020];
      }
      else {
        local_a8 = local_a8 - in_stack_00000010;
      }
      uVar6 = 0;
      for (local_84 = 0; local_84 < local_a4; local_84 = iVar1 + local_84) {
        for (local_8c = 0; local_8c < local_a8; local_8c = iVar3 + local_8c) {
          decode_reconstruct_tx
                    (pAVar7,in_RDX,r_00,(MB_MODE_INFO *)CONCAT44(uVar6,uVar5),
                     (int)((ulong)pAVar4 >> 0x20),(BLOCK_SIZE)((ulong)pAVar4 >> 0x18),unaff_retaddr,
                     in_stack_00000008,in_stack_00000010,TStack0000000000000018,
                     (int *)CONCAT71(in_stack_00000021,in_stack_00000020));
          _TStack0000000000000018 = iVar3 * iVar1 + _TStack0000000000000018;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void decode_reconstruct_tx(AV1_COMMON *cm, ThreadData *const td,
                                         aom_reader *r,
                                         MB_MODE_INFO *const mbmi, int plane,
                                         BLOCK_SIZE plane_bsize, int blk_row,
                                         int blk_col, int block,
                                         TX_SIZE tx_size, int *eob_total) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  // Scale to match transform block unit.
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size || plane) {
    td->read_coeffs_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                         tx_size);

    td->inverse_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                     tx_size);
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    *eob_total += eob_data->eob;
    set_cb_buffer_offsets(dcb, tx_size, plane);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int sub_step = bsw * bsh;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize, offsetr,
                              offsetc, block, sub_txs, eob_total);
        block += sub_step;
      }
    }
  }
}